

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O3

bool __thiscall trun::TestRunner::ExecuteMainExit(TestRunner *this)

{
  element_type *dynlib;
  Config *pCVar1;
  ResultSummary *this_00;
  bool bVar2;
  Ref result;
  Ref dummy;
  undefined1 local_88 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  __node_base local_28;
  CBPrePostHook local_20;
  
  pCVar1 = Config::Instance();
  bVar2 = true;
  if ((pCVar1->testGlobalMain == true) &&
     ((this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0)) {
    gnilk::Log::Info<char_const*>(this->pLogger,"Executing Global Exit");
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"_dummy-main_","");
    TestModule::Create((TestModule *)local_48,(string *)local_88);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    local_38._M_allocated_capacity = local_48._0_8_;
    local_38._8_8_ = local_48._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
      }
    }
    SetCurrentTestModule((Ref *)&local_38);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
    }
    local_58._M_allocated_capacity =
         (size_type)
         (this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dynlib = (this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_58._8_8_ =
         (this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count + 1;
      }
    }
    local_20.cbHookV1 = (TRUN_PRE_POST_HOOK_DELEGATE_V1 *)0x0;
    local_28._M_nxt = (_Hash_node_base *)0x0;
    TestFunc::Execute((TestFunc *)local_88,(Ref *)dynlib,(CBPrePostHook *)&local_58,&local_20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    this_00 = ResultSummary::Instance();
    local_88._32_8_ =
         (this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_60 = (this->globalExit).super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_60->_M_use_count = local_60->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_60->_M_use_count = local_60->_M_use_count + 1;
      }
    }
    ResultSummary::AddResult(this_00,(Ref *)(local_88 + 0x20));
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    bVar2 = true;
    if ((*(byte *)(local_88._0_8_ + 0x41) | 2) == 3) {
      pCVar1 = Config::Instance();
      if (pCVar1->stopOnAllFail == true) {
        gnilk::Log::Info<char_const*>(this->pLogger,"Total test failure, aborting");
        bVar2 = false;
      }
    }
    gnilk::Log::Info<char_const*>(this->pLogger,"Done: test main exit\n\n");
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  return bVar2;
}

Assistant:

bool TestRunner::ExecuteMainExit() {

    bool bRes = true;
    if (!Config::Instance().testGlobalMain) {
        return bRes;
    }
    if (globalExit == nullptr) {
        return bRes;
    }

    pLogger->Info("Executing Global Exit");

    // Create dummy module (see: ExecuteMain for expl.)
    auto dummy = TestModule::Create("_dummy-main_");
    SetCurrentTestModule(dummy);

    TestResult::Ref result = globalExit->Execute(library, {}, {});
    ResultSummary::Instance().AddResult(globalExit);

    if ((result->Result() == kTestResult_AllFail) || (result->Result() == kTestResult_TestFail)) {
        if (Config::Instance().stopOnAllFail) {
            pLogger->Info("Total test failure, aborting");
            bRes = false;
        }
    }

    pLogger->Info("Done: test main exit\n\n");
    return bRes;

}